

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrapolation.cc
# Opt level: O0

void __thiscall
tchecker::zg::details::global_m_extrapolation_t::global_m_extrapolation_t
          (global_m_extrapolation_t *this,
          shared_ptr<const_tchecker::clockbounds::global_m_map_t> *clock_bounds)

{
  shared_ptr<const_tchecker::clockbounds::global_m_map_t> *clock_bounds_local;
  global_m_extrapolation_t *this_local;
  
  extrapolation_t::extrapolation_t(&this->super_extrapolation_t);
  (this->super_extrapolation_t)._vptr_extrapolation_t =
       (_func_int **)&PTR__global_m_extrapolation_t_00429a58;
  std::shared_ptr<const_tchecker::clockbounds::global_m_map_t>::shared_ptr
            (&this->_clock_bounds,clock_bounds);
  return;
}

Assistant:

global_m_extrapolation_t::global_m_extrapolation_t(
    std::shared_ptr<tchecker::clockbounds::global_m_map_t const> const & clock_bounds)
    : _clock_bounds(clock_bounds)
{
}